

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_pcg.c
# Opt level: O2

SUNErrCode SUNLinSolSpace_PCG(SUNLinearSolver S,long *lenrwLS,long *leniwLS)

{
  sunindextype lrw1;
  sunindextype liw1;
  long local_30;
  long local_28;
  
  N_VSpace(*(undefined8 *)((long)S->content + 0x50),&local_30,&local_28);
  *lenrwLS = local_30 * 4 + 1;
  *leniwLS = local_28 * 4 + 4;
  return 0;
}

Assistant:

SUNErrCode SUNLinSolSpace_PCG(SUNLinearSolver S, long int* lenrwLS,
                              long int* leniwLS)
{
  SUNFunctionBegin(S->sunctx);
  sunindextype liw1, lrw1;
  N_VSpace(PCG_CONTENT(S)->r, &lrw1, &liw1);
  SUNCheckLastErr();
  *lenrwLS = 1 + lrw1 * 4;
  *leniwLS = 4 + liw1 * 4;
  return SUN_SUCCESS;
}